

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_nb_type(Curl_easy *data,connectdata *conn,_Bool ascii,ftpstate newstate)

{
  CURLcode CVar1;
  byte bVar2;
  
  bVar2 = !ascii << 3 | 0x41;
  if ((conn->proto).ftpc.transfertype == bVar2) {
    _ftp_state(data,newstate);
    CVar1 = ftp_state_type_resp(data,200,newstate);
    return CVar1;
  }
  CVar1 = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"TYPE %c",(ulong)bVar2);
  if (CVar1 == CURLE_OK) {
    _ftp_state(data,newstate);
    (conn->proto).ftpc.transfertype = bVar2;
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

static CURLcode ftp_nb_type(struct Curl_easy *data,
                            struct connectdata *conn,
                            bool ascii, ftpstate newstate)
{
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result;
  char want = (char)(ascii ? 'A' : 'I');

  if(ftpc->transfertype == want) {
    ftp_state(data, newstate);
    return ftp_state_type_resp(data, 200, newstate);
  }

  result = Curl_pp_sendf(data, &ftpc->pp, "TYPE %c", want);
  if(!result) {
    ftp_state(data, newstate);

    /* keep track of our current transfer type */
    ftpc->transfertype = want;
  }
  return result;
}